

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

void __thiscall cmCTestVC::cmCTestVC(cmCTestVC *this,cmCTest *ct,ostream *log)

{
  this->_vptr_cmCTestVC = (_func_int **)&PTR__cmCTestVC_005e1278;
  this->CTest = ct;
  this->Log = log;
  (this->CommandLineTool)._M_dataplus._M_p = (pointer)&(this->CommandLineTool).field_2;
  (this->CommandLineTool)._M_string_length = 0;
  (this->CommandLineTool).field_2._M_local_buf[0] = '\0';
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->UpdateCommandLine)._M_dataplus._M_p = (pointer)&(this->UpdateCommandLine).field_2;
  (this->UpdateCommandLine)._M_string_length = 0;
  (this->UpdateCommandLine).field_2._M_local_buf[0] = '\0';
  Revision::Revision(&this->Unknown);
  this->PathCount[0] = 0;
  this->PathCount[1] = 0;
  this->PathCount[2] = 0;
  std::__cxx11::string::assign((char *)&(this->Unknown).Date);
  std::__cxx11::string::assign((char *)&(this->Unknown).Author);
  std::__cxx11::string::assign((char *)&this->Unknown);
  return;
}

Assistant:

cmCTestVC::cmCTestVC(cmCTest* ct, std::ostream& log)
  : CTest(ct)
  , Log(log)
{
  this->PathCount[PathUpdated] = 0;
  this->PathCount[PathModified] = 0;
  this->PathCount[PathConflicting] = 0;
  this->Unknown.Date = "Unknown";
  this->Unknown.Author = "Unknown";
  this->Unknown.Rev = "Unknown";
}